

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O3

ssize_t __thiscall ZlibReader::read(ZlibReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  uLong uVar5;
  undefined4 in_register_00000034;
  uInt uVar6;
  ulong uVar7;
  
  uVar1 = this->zpos;
  puVar2 = (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  uVar4 = 0;
  if (uVar1 < uVar7) {
    uVar6 = (int)uVar7 - (int)uVar1;
    (this->z).next_in = puVar2 + uVar1;
    (this->z).avail_in = uVar6;
    (this->z).next_out = (Bytef *)CONCAT44(in_register_00000034,__fd);
    (this->z).avail_out = (uInt)__buf;
    uVar3 = inflate(&this->z,2);
    uVar4 = 0xffffffff;
    if (uVar3 < 2) {
      this->zpos = this->zpos + (ulong)(uVar6 - (this->z).avail_in);
      uVar4 = (long)__buf - (ulong)(this->z).avail_out;
      this->pos = this->pos + uVar4;
      uVar5 = crc32(this->crc,(Bytef *)CONCAT44(in_register_00000034,__fd),uVar4 & 0xffffffff);
      this->crc = uVar5;
      uVar4 = uVar4 & 0xffffffff;
    }
  }
  return uVar4;
}

Assistant:

int ZlibReader::read(const void * buf, size_t size)
{
	int zresult;

	if (zpos >= zbuf.size())
	{
		return 0;
	}

	uInt z_avail_in_old = (uInt) (zbuf.size() - zpos);

	z.next_in = ((Bytef *) &zbuf[0]) + zpos;
	z.avail_in = z_avail_in_old;
	z.next_out = (Bytef *) buf;
	z.avail_out = (uInt) size;
	zresult = inflate(&z, Z_SYNC_FLUSH);
	if (zresult != Z_OK && zresult != Z_STREAM_END)
	{
		return -1;
	}

	zpos += (z_avail_in_old - z.avail_in);

	size_t bytes_read = (size - z.avail_out);
	pos += bytes_read;

	crc = ::crc32(crc, (const Bytef *) buf, (uInt) bytes_read);

	return (int) bytes_read;
}